

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LdapStrategy.cpp
# Opt level: O3

Url * Vault::LdapStrategy::getUrl(Url *__return_storage_ptr__,Client *client,Path *username)

{
  long *local_48 [2];
  long local_38 [2];
  
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"/v1/auth/ldap/login/","");
  (*client->_vptr_Client[3])(__return_storage_ptr__,client,local_48,username);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Vault::Url Vault::LdapStrategy::getUrl(const Vault::Client &client,
                                       const Vault::Path &username) {
  return client.getUrl("/v1/auth/ldap/login/", username);
}